

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

int Abc_NtkMfsResubNode2(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  if (1 < iVar1) {
    for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_34 < iVar1; local_34 = local_34 + 1) {
      pObj = Abc_ObjFanin(pNode,local_34);
      iVar1 = Abc_ObjIsCi(pObj);
      if ((iVar1 == 0) && (iVar1 = Abc_ObjFanoutNum(pObj), iVar1 == 1)) {
        for (local_38 = 0; iVar1 = Abc_ObjFaninNum(pNode), local_38 < iVar1; local_38 = local_38 + 1
            ) {
          Abc_ObjFanin(pNode,local_38);
          if ((local_34 != local_38) &&
             (iVar1 = Abc_NtkMfsSolveSatResub2(p,pNode,local_34,local_38), iVar1 != 0)) {
            return 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int Abc_NtkMfsResubNode2( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin, * pFanin2;
    int i, k;
/*
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        }
*/
    if ( Abc_ObjFaninNum(pNode) < 2 )
        return 0;
    // try replacing one area critical fanin and one other fanin while adding two new fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            // consider second fanin to remove at the same time
            Abc_ObjForEachFanin( pNode, pFanin2, k )
            {
                if ( i != k && Abc_NtkMfsSolveSatResub2( p, pNode, i, k ) )
                    return 1;
            }
        }
    }
    return 0;
}